

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStep_StageDIRKFast(ARKodeMem ark_mem,ARKodeMRIStepMem step_mem,int is,int *nflagPtr)

{
  arkProcessError(ark_mem,-0x29,"ARKode::MRIStep","mriStep_StageDIRKFast",
                  "This routine is not yet implemented.");
  return -0x29;
}

Assistant:

int mriStep_StageDIRKFast(ARKodeMem ark_mem, ARKodeMRIStepMem step_mem,
                          int is, int *nflagPtr)
{
#ifdef SUNDIALS_DEBUG
  printf("    MRIStep DIRK fast stage\n");
#endif

  /* this is not currently implemented */
  arkProcessError(ark_mem, ARK_INVALID_TABLE, "ARKode::MRIStep",
                  "mriStep_StageDIRKFast",
                  "This routine is not yet implemented.");
  return(ARK_INVALID_TABLE);
}